

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_clear(nk_context *ctx)

{
  nk_size *pnVar1;
  nk_command_buffer *__s;
  undefined8 *puVar2;
  nk_size nVar3;
  nk_window *pnVar4;
  nk_page_element *pnVar5;
  nk_table *pnVar6;
  nk_window *win;
  nk_page_element *elem;
  nk_size nVar7;
  nk_page_element *pnVar8;
  size_t __n;
  size_t __n_00;
  ulong __n_01;
  nk_page_data *pd;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3eae,"void nk_clear(struct nk_context *)");
  }
  if (ctx->use_pool == 0) {
    nVar3 = (ctx->memory).marker[0].offset;
    pnVar1 = &(ctx->memory).needed;
    *pnVar1 = *pnVar1 + (nVar3 - (ctx->memory).allocated);
    nVar7 = 0;
    if ((ctx->memory).marker[0].active != 0) {
      nVar7 = nVar3;
    }
    (ctx->memory).allocated = nVar7;
    (ctx->memory).marker[0].active = 0;
  }
  else {
    (ctx->memory).allocated = 0;
    (ctx->memory).needed = 0;
    (ctx->memory).size = (ctx->memory).memory.size;
  }
  ctx->build = 0;
  (ctx->memory).calls = 0;
  ctx->last_widget_state = 0;
  (ctx->style).cursor_active = (ctx->style).cursors[0];
  __s = &ctx->overlay;
  __n_01 = (ulong)__s & 3;
  if (__n_01 == 0) {
    (ctx->overlay).end = 0;
    (ctx->overlay).last = 0;
    (ctx->overlay).userdata.ptr = (void *)0x0;
    (ctx->overlay).begin = 0;
    (ctx->overlay).clip.w = 0.0;
    (ctx->overlay).clip.h = 0.0;
    *(undefined8 *)&(ctx->overlay).use_clipping = 0;
    __s->base = (nk_buffer *)0x0;
    (ctx->overlay).clip.x = 0.0;
    (ctx->overlay).clip.y = 0.0;
  }
  else {
    memset(__s,0,4 - __n_01);
    puVar2 = (undefined8 *)((long)__s + (4 - __n_01));
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    *(undefined8 *)((long)puVar2 + 0x2c) = 0;
    *(undefined8 *)((long)puVar2 + 0x34) = 0;
    memset((void *)((long)puVar2 + 0x3c),0,__n_01);
  }
  nk_draw_list_clear(&ctx->draw_list);
  win = ctx->begin;
  while (win != (nk_window *)0x0) {
    if ((win->flags & 0x6000) == 0x4000) {
      win = win->next;
    }
    else {
      pnVar4 = (win->popup).win;
      if ((pnVar4 != (nk_window *)0x0) && (pnVar4->seq != ctx->seq)) {
        nk_free_window(ctx,pnVar4);
        (win->popup).win = (nk_window *)0x0;
      }
      pnVar5 = (nk_page_element *)win->tables;
      pnVar8 = (nk_page_element *)win->tables;
      while (elem = pnVar5, elem != (nk_page_element *)0x0) {
        pnVar5 = (nk_page_element *)(elem->data).tbl.next;
        if ((elem->data).tbl.seq != ctx->seq) {
          if (pnVar8 == elem) {
            win->tables = (nk_table *)pnVar5;
          }
          pnVar6 = (elem->data).tbl.prev;
          if (pnVar5 != (nk_page_element *)0x0) {
            (pnVar5->data).tbl.prev = pnVar6;
          }
          if (pnVar6 != (nk_table *)0x0) {
            pnVar6->next = (nk_table *)pnVar5;
          }
          (elem->data).tbl.next = (nk_table *)0x0;
          (elem->data).tbl.prev = (nk_table *)0x0;
          __n = (ulong)elem & 3;
          if (__n == 0) {
            __n = 0x1c0;
            pnVar8 = elem;
          }
          else {
            __n_00 = -__n + 4;
            memset(elem,0,__n_00);
            memset((void *)((long)elem + __n_00),0,0x1bc);
            pnVar8 = (nk_page_element *)((long)elem + -__n + 0x1c0);
          }
          memset(pnVar8,0,__n);
          nk_free_page_element(ctx,elem);
          pnVar8 = (nk_page_element *)win->tables;
          if (elem == (nk_page_element *)win->tables) {
            win->tables = (nk_table *)pnVar5;
            pnVar8 = pnVar5;
          }
        }
      }
      if ((win->seq == ctx->seq) && ((win->flags & 0x2000) == 0)) {
        win = win->next;
      }
      else {
        pnVar4 = win->next;
        nk_remove_window(ctx,win);
        nk_free_window(ctx,win);
        win = pnVar4;
      }
    }
  }
  ctx->seq = ctx->seq + 1;
  return;
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_clear(&ctx->draw_list);
#endif

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure minimized windows do not get removed */
        if ((iter->flags & NK_WINDOW_MINIMIZED) &&
            !(iter->flags & NK_WINDOW_CLOSED)) {
            iter = iter->next;
            continue;
        }

        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }

        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            }
            it = n;
        }}

        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}